

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testSetData(tst_InsertProxyModel *this)

{
  uint uVar1;
  QObject *parent;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  uint *puVar6;
  ModelTest *this_00;
  QVariant local_158;
  QString local_138;
  QVariant local_120;
  QString local_100;
  undefined4 local_e4;
  QVariant local_e0;
  QArrayDataPointer<char16_t> local_c0;
  undefined1 local_a8 [8];
  QString idxData;
  undefined1 local_78 [8];
  QModelIndex proxyIdX;
  InsertProxyModel local_50 [8];
  InsertProxyModel proxyModel;
  int idxCol;
  int idxRow;
  QAbstractItemModel *baseModel;
  tst_InsertProxyModel *this_local;
  char16_t *str;
  
  iVar4 = qMetaTypeId<QAbstractItemModel*>();
  puVar5 = (undefined8 *)QTest::qData("baseModel",iVar4);
  parent = (QObject *)*puVar5;
  if (parent != (QObject *)0x0) {
    iVar4 = qMetaTypeId<int>();
    puVar6 = (uint *)QTest::qData("idxRow",iVar4);
    uVar1 = *puVar6;
    iVar4 = qMetaTypeId<int>();
    QTest::qData("idxCol",iVar4);
    InsertProxyModel::InsertProxyModel(local_50,(QObject *)0x0);
    this_00 = (ModelTest *)operator_new(0x10);
    ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_50,parent);
    InsertProxyModel::setMergeDisplayEdit(SUB81(local_50,0));
    proxyIdX.m._0_4_ = operator|(InsertColumn,InsertRow);
    InsertProxyModel::setInsertDirection((QFlags_conflict1 *)local_50);
    InsertProxyModel::setSourceModel((QAbstractItemModel *)local_50);
    QModelIndex::QModelIndex((QModelIndex *)&idxData.d.size);
    InsertProxyModel::index((int)local_78,(int)local_50,(QModelIndex *)(ulong)uVar1);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_c0,(Data *)0x0,L"Test",4);
    QString::QString((QString *)local_a8,&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QVariant::QVariant(&local_e0,(QString *)local_a8);
    bVar2 = InsertProxyModel::setData((QModelIndex *)local_50,(QVariant *)local_78,(int)&local_e0);
    bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                           "proxyModel.setData(proxyIdX, idxData, Qt::DisplayRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x2d8);
    QVariant::~QVariant(&local_e0);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      InsertProxyModel::data((QModelIndex *)&local_120,(int)local_50);
      QVariant::toString();
      bVar3 = QTest::qCompare(&local_100,(QString *)local_a8,
                              "proxyModel.data(proxyIdX, Qt::DisplayRole).toString()","idxData",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                              ,0x2d9);
      QString::~QString(&local_100);
      QVariant::~QVariant(&local_120);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        InsertProxyModel::data((QModelIndex *)&local_158,(int)local_50);
        QVariant::toString();
        bVar3 = QTest::qCompare(&local_138,(QString *)local_a8,
                                "proxyModel.data(proxyIdX, Qt::EditRole).toString()","idxData",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                ,0x2da);
        QString::~QString(&local_138);
        QVariant::~QVariant(&local_158);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          QObject::deleteLater();
          local_e4 = 0;
        }
        else {
          local_e4 = 1;
        }
      }
      else {
        local_e4 = 1;
      }
    }
    else {
      local_e4 = 1;
    }
    QString::~QString((QString *)local_a8);
    InsertProxyModel::~InsertProxyModel(local_50);
  }
  return;
}

Assistant:

void tst_InsertProxyModel::testSetData()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(int, idxRow);
    QFETCH(int, idxCol);
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setMergeDisplayEdit(true);
    proxyModel.setInsertDirection(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(baseModel);
    const QModelIndex proxyIdX = proxyModel.index(idxRow, idxCol);
    const QString idxData = QStringLiteral("Test");
    QVERIFY(proxyModel.setData(proxyIdX, idxData, Qt::DisplayRole));
    QCOMPARE(proxyModel.data(proxyIdX, Qt::DisplayRole).toString(), idxData);
    QCOMPARE(proxyModel.data(proxyIdX, Qt::EditRole).toString(), idxData);
    baseModel->deleteLater();
}